

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

base_learner * GD::setup(options_i *options,vw *all)

{
  size_t sVar1;
  bool bVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  pointer pgVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  ostream *poVar9;
  pointer pgVar10;
  learner<GD::gd,_example> *this;
  option_group_definition *this_00;
  vw *in_RSI;
  long *in_RDI;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  learner<GD::gd,_example> *ret;
  gd *bare;
  uint64_t stride;
  stringstream __msg;
  bool feature_mask_off;
  option_group_definition new_options;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  free_ptr<GD::gd> g;
  undefined4 in_stack_fffffffffffff2e8;
  uint32_t in_stack_fffffffffffff2ec;
  typed_option<double> *in_stack_fffffffffffff2f0;
  vw *in_stack_fffffffffffff2f8;
  typed_option<double> *in_stack_fffffffffffff300;
  free_ptr<GD::gd> *dat;
  string *in_stack_fffffffffffff308;
  _func_void_gd_ptr_base_learner_ptr_example_ptr *f;
  undefined8 in_stack_fffffffffffff310;
  int plineNumber;
  learner<GD::gd,_example> *this_01;
  undefined4 in_stack_fffffffffffff318;
  undefined4 in_stack_fffffffffffff31c;
  vw_exception *in_stack_fffffffffffff320;
  typed_option<double> *in_stack_fffffffffffff338;
  option_group_definition *in_stack_fffffffffffff340;
  byte local_c7b;
  byte local_c62;
  byte local_c4a;
  byte local_c37;
  byte local_c36;
  byte local_c35;
  float local_bdc;
  stringstream local_a68 [16];
  ostream local_a58;
  allocator local_8d9;
  string local_8d8 [37];
  byte local_8b3;
  byte local_8b2;
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [38];
  undefined1 local_812;
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [32];
  typed_option<double> local_7c8;
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [32];
  typed_option<double> local_6d8;
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [199];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [199];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [199];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [199];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [215];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [59];
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  free_ptr<GD::gd> local_20;
  vw *local_10;
  long *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff310 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  scoped_calloc_or_throw<GD::gd>();
  local_21 = 0;
  local_22 = 0;
  local_23 = 0;
  local_24 = 0;
  local_25 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Gradient Descent options",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"sgd",&local_159);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"use regular stochastic gradient descent update.",&local_181);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff340,(typed_option<bool> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"adaptive",&local_249);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"use adaptive, individual learning rates.",&local_271);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff340,(typed_option<bool> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"adax",&local_339);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_360,"use adaptive learning rates with x^2 instead of g^2x^2",&local_361);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff340,(typed_option<bool> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"invariant",&local_429);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"use safe/importance aware updates.",&local_451);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff340,(typed_option<bool> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"normalized",&local_519);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"use per feature normalized updates",&local_541);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff340,(typed_option<bool> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"sparse_l2",&local_609);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
            ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af43f);
  VW::config::make_option<float>
            ((string *)in_stack_fffffffffffff2f8,(float *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff300,
             (float)((ulong)in_stack_fffffffffffff2f8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"use per feature normalized updates",&local_631);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff340,(typed_option<float> *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"l1_state",&local_6f9);
  VW::config::make_option<double>
            ((string *)in_stack_fffffffffffff2f8,(double *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<double>::keep(&local_6d8,(bool)(local_10->save_resume & 1));
  VW::config::typed_option<double>::default_value
            (in_stack_fffffffffffff300,(double)in_stack_fffffffffffff2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"use per feature normalized updates",&local_721);
  VW::config::typed_option<double>::help
            (in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"l2_state",&local_7e9);
  VW::config::make_option<double>
            ((string *)in_stack_fffffffffffff2f8,(double *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<double>::keep(&local_7c8,(bool)(local_10->save_resume & 1));
  VW::config::typed_option<double>::default_value
            (in_stack_fffffffffffff300,(double)in_stack_fffffffffffff2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"use per feature normalized updates",&local_811);
  VW::config::typed_option<double>::help
            (in_stack_fffffffffffff2f0,
             (string *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  VW::config::typed_option<double>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  VW::config::typed_option<double>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_8)(local_8,local_60);
  pvVar3 = local_10;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af93e);
  pgVar6->all = pvVar3;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af957);
  pgVar6->all->normalized_sum_norm_x = 0.0;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af973);
  pgVar6->no_win_counter = 0;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af988);
  pgVar6->total_weight = 0.0;
  if ((local_10->adaptive & 1U) == 0) {
    local_bdc = -1.0;
  }
  else {
    local_bdc = local_10->power_t - 1.0;
  }
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1af9f9);
  pgVar6->neg_norm_power = local_bdc;
  fVar11 = local_10->power_t;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1afa3a);
  pgVar6->neg_power_t = -fVar11;
  bVar2 = local_10->adaptive;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1afa6a);
  pgVar6->adaptive = (bool)(bVar2 & 1);
  bVar2 = local_10->normalized_updates;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1afa99);
  pgVar6->normalized = (bool)(bVar2 & 1);
  if (0.0 < local_10->initial_t) {
    fVar11 = local_10->initial_t;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1afaec);
    pgVar6->all->normalized_sum_norm_x = (double)fVar11;
    fVar11 = local_10->initial_t;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1afb2b);
    pgVar6->total_weight = (double)fVar11;
  }
  plVar4 = local_8;
  local_812 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"feature_mask",&local_839);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_838);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  if ((bVar5 & 1) != 0) {
    local_812 = 0;
  }
  if ((local_10->holdout_set_off & 1U) == 0) {
    local_10->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_860,"early_terminate",&local_861);
    VW::config::options_i::get_typed_option<unsigned_long>
              ((options_i *)in_stack_fffffffffffff320,
               (string *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    uVar7 = VW::config::typed_option<unsigned_long>::value
                      ((typed_option<unsigned_long> *)in_stack_fffffffffffff2f0);
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b02a7);
    pgVar6->early_stop_thres = uVar7;
    std::__cxx11::string::~string(local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
  }
  fVar11 = local_10->initial_constant;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b033e);
  plVar4 = local_8;
  pgVar6->initial_constant = fVar11;
  if (((((local_21 & 1) == 0) && ((local_22 & 1) == 0)) && ((local_24 & 1) == 0)) &&
     ((local_25 & 1) == 0)) {
    local_10->adaptive = (bool)(local_10->training & 1);
    local_10->invariant_updates = (bool)(local_10->training & 1);
    local_10->normalized_updates = (bool)(local_10->training & 1);
  }
  else {
    local_c35 = 0;
    if ((local_10->training & 1U) != 0) {
      local_c35 = local_22;
    }
    local_10->adaptive = (bool)(local_c35 & 1);
    local_c36 = 0;
    if ((local_10->training & 1U) != 0) {
      local_c36 = local_24;
    }
    local_10->invariant_updates = (bool)(local_c36 & 1);
    local_c37 = 0;
    if ((local_10->training & 1U) != 0) {
      local_c37 = local_25;
    }
    local_10->normalized_updates = (bool)(local_c37 & 1);
    std::allocator<char>::allocator();
    local_8b2 = 0;
    local_8b3 = 0;
    std::__cxx11::string::string(local_888,"learning_rate",&local_889);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_888);
    plVar4 = local_8;
    local_c4a = 0;
    if ((bVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      local_8b2 = 1;
      std::__cxx11::string::string(local_8b0,"l",&local_8b1);
      local_8b3 = 1;
      bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_8b0);
      local_c4a = 0;
      if ((bVar5 & 1) == 0) {
        local_c62 = 0;
        if ((local_10->adaptive & 1U) != 0) {
          local_c62 = local_10->normalized_updates;
        }
        local_c4a = local_c62 ^ 0xff;
      }
    }
    if ((local_8b3 & 1) != 0) {
      std::__cxx11::string::~string(local_8b0);
    }
    if ((local_8b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    }
    std::__cxx11::string::~string(local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
    if ((local_c4a & 1) != 0) {
      local_10->eta = 10.0;
    }
    if (((local_10->adaptive & 1U) == 0) && ((local_10->normalized_updates & 1U) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d8,"initial_t",&local_8d9);
      bVar5 = (**(code **)(*local_8 + 8))(local_8,local_8d8);
      std::__cxx11::string::~string(local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        local_10->sd->t = 1.0;
        local_10->initial_t = 1.0;
      }
      fVar11 = powf((float)local_10->sd->t,local_10->power_t);
      local_10->eta = fVar11 * local_10->eta;
    }
  }
  if ((local_23 & 1) != 0) {
    local_c7b = 0;
    if ((local_10->training & 1U) != 0) {
      local_c7b = local_23;
    }
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b08f6);
    pgVar6->adax = (bool)(local_c7b & 1);
  }
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0910);
  if (((pgVar6->adax & 1U) != 0) && ((local_10->adaptive & 1U) == 0)) {
    std::__cxx11::stringstream::stringstream(local_a68);
    std::operator<<(&local_a58,"Cannot use adax without adaptive");
    uVar8 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffff320,
               (char *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),plineNumber,
               in_stack_fffffffffffff308);
    __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  sVar1 = local_10->numpasses;
  auVar13._8_4_ = (int)(sVar1 >> 0x20);
  auVar13._0_8_ = sVar1;
  auVar13._12_4_ = 0x45300000;
  dVar12 = pow((double)local_10->eta_decay_rate,
               (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  if (dVar12 < 0.0001) {
    poVar9 = std::operator<<(&(local_10->trace_message).super_ostream,
                             "Warning: the learning rate for the last pass is multiplied by: ");
    sVar1 = local_10->numpasses;
    auVar14._8_4_ = (int)(sVar1 >> 0x20);
    auVar14._0_8_ = sVar1;
    auVar14._12_4_ = 0x45300000;
    dVar12 = pow((double)local_10->eta_decay_rate,
                 (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
    poVar9 = std::operator<<(poVar9," adjust --decay_learning_rate larger to avoid this.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  if (local_10->reg_mode % 2 == 0) {
    if (((local_10->audit & 1U) == 0) && ((local_10->hash_inv & 1U) == 0)) {
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0c5a);
      pgVar6->predict = predict<false,false>;
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0c72);
      pgVar6->multipredict = multipredict<false,false>;
    }
    else {
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0c28);
      pgVar6->predict = predict<false,true>;
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0c40);
      pgVar6->multipredict = multipredict<false,true>;
    }
  }
  else if (((local_10->audit & 1U) == 0) && ((local_10->hash_inv & 1U) == 0)) {
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0bd1);
    pgVar6->predict = predict<true,false>;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0be9);
    pgVar6->multipredict = multipredict<true,false>;
  }
  else {
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0b9f);
    pgVar6->predict = predict<true,true>;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0bb7);
    pgVar6->multipredict = multipredict<true,true>;
  }
  if ((local_10->power_t != 0.5) || (NAN(local_10->power_t))) {
    std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
              ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_fffffffffffff2f0);
    set_learn<false>(in_stack_fffffffffffff2f8,SUB81((ulong)in_stack_fffffffffffff2f0 >> 0x38,0),
                     (gd *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  }
  else {
    std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
              ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_fffffffffffff2f0);
    set_learn<true>(in_stack_fffffffffffff2f8,SUB81((ulong)in_stack_fffffffffffff2f0 >> 0x38,0),
                    (gd *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  }
  ceil_log_2(CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  parameters::stride_shift((parameters *)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec);
  dat = &local_20;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_fffffffffffff2f0);
  pgVar10 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                      ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1b0da2);
  f = pgVar10->learn;
  this_01 = (learner<GD::gd,_example> *)pgVar6->predict;
  parameters::stride_shift
            ((parameters *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  this = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                   (dat,(_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                        in_stack_fffffffffffff2f8,
                    (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                    in_stack_fffffffffffff2f0,
                    CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
  LEARNER::learner<GD::gd,_example>::set_sensitivity(this,pgVar6->sensitivity);
  LEARNER::learner<GD::gd,example>::set_multipredict<LEARNER::learner<char,char>>
            ((learner<GD::gd,example> *)this,
             (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool
              *)pgVar6->multipredict);
  LEARNER::learner<GD::gd,example>::set_update<LEARNER::learner<char,char>>
            ((learner<GD::gd,example> *)this,
             (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)pgVar6->update);
  LEARNER::learner<GD::gd,_example>::set_save_load(this,save_load);
  LEARNER::learner<GD::gd,_example>::set_end_pass(this_01,(_func_void_gd_ptr *)f);
  this_00 = (option_group_definition *)LEARNER::make_base<GD::gd,example>(this);
  VW::config::option_group_definition::~option_group_definition(this_00);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::~unique_ptr(dat);
  return (base_learner *)this_00;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}